

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirmataMarshaller.cpp
# Opt level: O0

void __thiscall
firmata::FirmataMarshaller::sendDigital(FirmataMarshaller *this,uint8_t pin,uint8_t value)

{
  FirmataMarshaller *__n;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined7 in_register_00000011;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint8_t value_local;
  uint8_t pin_local;
  FirmataMarshaller *this_local;
  
  if (this->FirmataStream != (Stream *)0x0) {
    __n = this;
    serial_wiring::Stream::write
              (this->FirmataStream,0xf5,(void *)CONCAT71(in_register_00000011,value),(size_t)this);
    serial_wiring::Stream::write
              (this->FirmataStream,(uint)(pin & 0x7f),(void *)CONCAT71(extraout_var,extraout_DL),
               (size_t)__n);
    serial_wiring::Stream::write
              (this->FirmataStream,(uint)(value != '\0'),
               (void *)CONCAT71(extraout_var_00,extraout_DL_00),(size_t)__n);
  }
  return;
}

Assistant:

void FirmataMarshaller::sendDigital(uint8_t pin, uint8_t value)
const
{
  if ( (Stream *)NULL == FirmataStream ) { return; }
  FirmataStream->write(SET_DIGITAL_PIN_VALUE);
  FirmataStream->write(pin & 0x7F);
  FirmataStream->write(value != 0);
}